

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecoration
          (DecorationManager *this,uint32_t inst_id,uint32_t decoration)

{
  long lVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_100;
  uint32_t local_fc;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  init_list._M_len = 1;
  init_list._M_array = &local_fc;
  local_fc = inst_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  local_f8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),&local_70);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_100;
  local_100 = decoration;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  local_c8 = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_f8,&local_98);
  AddDecoration(this,OpDecorate,
                (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48
               );
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar1 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  return;
}

Assistant:

void DecorationManager::AddDecoration(uint32_t inst_id, uint32_t decoration) {
  AddDecoration(
      spv::Op::OpDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}}});
}